

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

const_iterator * __thiscall
google::
sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::find<int>(sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
            *this,int *key)

{
  st_iterator it;
  st_iterator it_end;
  size_type sVar1;
  const_nonempty_iterator in_RSI;
  const_iterator *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<unsigned_long,_unsigned_long> pos;
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  *in_stack_ffffffffffffff50;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
  *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  *in_stack_ffffffffffffff80;
  const_iterator *this_00;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  sVar1 = size(in_stack_ffffffffffffff50);
  if (sVar1 == 0) {
    end(in_stack_ffffffffffffffe0);
  }
  else {
    pVar2 = find_position<int>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (pVar2.first == 0xffffffffffffffff) {
      end((sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
           *)0xffffffffffffffff);
    }
    else {
      sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::get_iter
                ((sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
                 this_00,(size_type)in_RDI);
      sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::nonempty_end
                (in_stack_ffffffffffffff70);
      it.row_end._M_current =
           (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
           local_60;
      it.row_begin._M_current =
           (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
           local_28;
      it.row_current._M_current =
           (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
           local_58;
      it.col_current = local_50;
      it_end.row_end._M_current =
           (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)in_RDI
      ;
      it_end.row_begin._M_current =
           (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
           local_48;
      it_end.row_current._M_current =
           (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
           this_00;
      it_end.col_current = in_RSI;
      sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
      ::sparse_hashtable_const_iterator(local_38,local_40,it,it_end);
    }
  }
  return this_00;
}

Assistant:

const_iterator find(const K& key) const {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return const_iterator(this, table.get_iter(pos.first),
                            table.nonempty_end());
  }